

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::KahanSumState,double,duckdb::DoubleSumOperation<duckdb::KahanAdd>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  double *pdVar2;
  data_ptr_t pdVar3;
  ulong uVar4;
  sel_t *psVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_68;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar3 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar6 = 0;
      uVar11 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar7 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar7 = count;
          }
LAB_0193fb43:
          uVar8 = uVar11;
          if (uVar11 < uVar7) {
            dVar14 = *(double *)(state + 0x10);
            dVar15 = *(double *)(state + 8);
            do {
              dVar14 = *(double *)(pdVar3 + uVar11 * 8) - dVar14;
              dVar16 = dVar15 + dVar14;
              dVar14 = (dVar16 - dVar15) - dVar14;
              uVar11 = uVar11 + 1;
              dVar15 = dVar16;
            } while (uVar7 != uVar11);
            *state = '\x01';
            *(double *)(state + 0x10) = dVar14;
            *(double *)(state + 8) = dVar16;
            uVar8 = uVar7;
          }
        }
        else {
          uVar4 = puVar1[uVar6];
          uVar7 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar7 = count;
          }
          if (uVar4 == 0xffffffffffffffff) goto LAB_0193fb43;
          uVar8 = uVar7;
          if ((uVar4 != 0) && (uVar8 = uVar11, uVar11 < uVar7)) {
            uVar12 = 0;
            do {
              if ((uVar4 >> (uVar12 & 0x3f) & 1) != 0) {
                *state = '\x01';
                dVar14 = *(double *)(pdVar3 + uVar12 * 8 + uVar11 * 8) - *(double *)(state + 0x10);
                dVar15 = *(double *)(state + 8) + dVar14;
                *(double *)(state + 0x10) = (dVar15 - *(double *)(state + 8)) - dVar14;
                *(double *)(state + 8) = dVar15;
              }
              uVar12 = uVar12 + 1;
              uVar8 = uVar7;
            } while (uVar7 - uVar11 != uVar12);
          }
        }
        uVar6 = uVar6 + 1;
        uVar11 = uVar8;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      pdVar2 = (double *)input->data;
      auVar13._8_4_ = (int)(count >> 0x20);
      auVar13._0_8_ = count;
      auVar13._12_4_ = 0x45300000;
      *state = '\x01';
      dVar14 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)count) - 4503599627370496.0)) * *pdVar2 -
               *(double *)(state + 0x10);
      dVar15 = *(double *)(state + 8) + dVar14;
      *(double *)(state + 0x10) = (dVar15 - *(double *)(state + 8)) - dVar14;
      *(double *)(state + 8) = dVar15;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        dVar14 = *(double *)(state + 0x10);
        iVar9 = 0;
        dVar15 = *(double *)(state + 8);
        do {
          iVar10 = iVar9;
          if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
            iVar10 = (idx_t)(local_68.sel)->sel_vector[iVar9];
          }
          dVar16 = dVar15 + (*(double *)(local_68.data + iVar10 * 8) - dVar14);
          dVar14 = (dVar16 - dVar15) - (*(double *)(local_68.data + iVar10 * 8) - dVar14);
          iVar9 = iVar9 + 1;
          dVar15 = dVar16;
        } while (count != iVar9);
        *state = '\x01';
        *(double *)(state + 0x10) = dVar14;
        *(double *)(state + 8) = dVar16;
      }
    }
    else if (count != 0) {
      psVar5 = (local_68.sel)->sel_vector;
      iVar9 = 0;
      do {
        iVar10 = iVar9;
        if (psVar5 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar5[iVar9];
        }
        if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar10 >> 6]
             >> (iVar10 & 0x3f) & 1) != 0) {
          *state = '\x01';
          dVar14 = *(double *)(state + 8) +
                   (*(double *)(local_68.data + iVar10 * 8) - *(double *)(state + 0x10));
          *(double *)(state + 0x10) =
               (dVar14 - *(double *)(state + 8)) -
               (*(double *)(local_68.data + iVar10 * 8) - *(double *)(state + 0x10));
          *(double *)(state + 8) = dVar14;
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}